

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

bool pbrt::ParseArg<bool*>
               (char ***argv,string *name,bool *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  string value;
  string arg;
  __string_type __str;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  _Any_data *local_38;
  
  local_38 = (_Any_data *)onError;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,**argv,(allocator<char> *)&local_d8);
  if (local_98._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_98);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_98);
  }
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_4::normalizeArg(&local_d8,&local_98);
  pcVar3 = (name->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_78._M_string_length,0,'\x01');
  anon_unknown_4::normalizeArg(&local_b8,&local_78);
  if (local_d8._M_string_length < local_b8._M_string_length) {
LAB_001dadab:
    bVar7 = false;
  }
  else {
    bVar7 = local_b8._M_string_length == 0;
    if (!bVar7) {
      if (*local_b8._M_dataplus._M_p != *local_d8._M_dataplus._M_p) goto LAB_001dadab;
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (local_b8._M_string_length == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (local_b8._M_dataplus._M_p[uVar6] == local_d8._M_dataplus._M_p[uVar6]);
      bVar7 = local_b8._M_string_length <= uVar6;
    }
  }
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    anon_unknown_4::normalizeArg(&local_d8,&local_98);
    anon_unknown_4::normalizeArg(&local_b8,name);
    if (local_d8._M_string_length == local_b8._M_string_length) {
      if (local_d8._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar5 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_d8._M_string_length);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      *argv = *argv + 1;
      *out = true;
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    goto LAB_001dafd0;
  }
  *argv = *argv + 1;
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_98);
  anon_unknown_4::normalizeArg(&local_d8,&local_b8);
  iVar5 = std::__cxx11::string::compare((char *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 == 0) {
    bVar7 = false;
LAB_001daef8:
    *out = bVar7;
    bVar7 = true;
  }
  else {
    anon_unknown_4::normalizeArg(&local_d8,&local_b8);
    iVar5 = std::__cxx11::string::compare((char *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      bVar7 = true;
      goto LAB_001daef8;
    }
    bVar7 = false;
  }
  if (!bVar7) {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
              (&local_58,"invalid value \"%s\" for %s argument",&local_b8,name);
    if (*(long *)(local_38 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(local_38->_M_pod_data + 0x18))(local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_001dafd0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}